

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intpow.hpp
# Opt level: O0

unsigned_long
burst::detail::intpow_impl<unsigned_long,unsigned_long>(unsigned_long x,unsigned_long exponent)

{
  undefined8 local_20;
  unsigned_long result;
  unsigned_long exponent_local;
  unsigned_long x_local;
  
  local_20 = 1;
  exponent_local = x;
  for (result = exponent; result != 0; result = result >> 1) {
    if ((result & 1) != 0) {
      local_20 = exponent_local * local_20;
    }
    exponent_local = exponent_local * exponent_local;
  }
  return local_20;
}

Assistant:

constexpr auto intpow_impl (Integer1 x, Integer2 exponent)
        {
            auto result = Integer1{1};

            while (exponent > 0)
            {
                if ((exponent & 0x01) != 0)
                {
                    result *= x;
                }

                x *= x;
                exponent >>= 1;
            }

            return result;
        }